

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O2

bool absl::(anonymous_namespace)::Base64UnescapeInternal<std::__cxx11::string>
               (Nullable<const_char_*> src,size_t slen,
               Nonnull<std::__cxx11::basic_string<char>_*> dest,
               Nonnull<const_signed_char_*> unbase64)

{
  byte bVar1;
  pointer pcVar2;
  bool bVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  byte *pbVar8;
  byte *pbVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  
  uVar11 = slen - (slen >> 2);
  std::__cxx11::string::resize((ulong)dest);
  pcVar2 = (dest->_M_dataplus)._M_p;
  iVar13 = 3;
  uVar12 = 0;
  if (pcVar2 == (pointer)0x0) {
    uVar6 = 0;
    uVar10 = 0;
    uVar7 = 0;
LAB_00112730:
    pbVar8 = (byte *)src;
    uVar19 = slen;
    if (3 < slen) {
      if (((((ulong)(byte)*src == 0) || ((ulong)((byte *)src)[1] == 0)) ||
          ((ulong)((byte *)src)[2] == 0)) ||
         (uVar7 = (int)unbase64[((byte *)src)[3]] |
                  (int)unbase64[((byte *)src)[2]] << 6 |
                  (int)unbase64[((byte *)src)[1]] << 0xc | (int)unbase64[(byte)*src] << 0x12,
         (int)uVar7 < 0)) {
        uVar17 = slen - 2;
        uVar14 = slen - 3;
        uVar16 = slen - 4;
        uVar18 = 0;
LAB_001127ae:
        uVar10 = (ulong)*pbVar8;
        uVar6 = (uint)unbase64[uVar10];
        if ((int)uVar6 < 0) {
          uVar19 = uVar19 - 1;
          pbVar8 = pbVar8 + 1;
          if (((&ascii_internal::kPropertyBits)[uVar10] & 8) != 0) goto code_r0x001127cf;
          goto LAB_00112897;
        }
        goto LAB_0011280a;
      }
      uVar19 = slen - 4;
      pbVar8 = (byte *)src + 4;
      goto LAB_00112881;
    }
    goto LAB_001128f1;
  }
  uVar6 = 0;
  uVar10 = 0;
  uVar7 = 0;
LAB_00112595:
  lVar15 = -2;
  pbVar8 = (byte *)src;
  uVar19 = slen;
  if (3 < slen) {
    if ((((ulong)(byte)*src == 0) || ((ulong)((byte *)src)[1] == 0)) ||
       (((ulong)((byte *)src)[2] == 0 ||
        (uVar7 = (int)unbase64[((byte *)src)[3]] |
                 (int)unbase64[((byte *)src)[2]] << 6 |
                 (int)unbase64[((byte *)src)[1]] << 0xc | (int)unbase64[(byte)*src] << 0x12,
        (int)uVar7 < 0)))) {
      uVar17 = slen - 4;
      uVar14 = 0;
LAB_00112607:
      bVar1 = *pbVar8;
      uVar10 = (ulong)bVar1;
      uVar5 = (uint)unbase64[bVar1];
      if (unbase64[bVar1] < '\0') {
        uVar19 = uVar19 - 1;
        pbVar8 = pbVar8 + 1;
        if (((&ascii_internal::kPropertyBits)[bVar1] & 8) != 0) goto code_r0x00112628;
        goto LAB_0011288a;
      }
      goto LAB_0011263f;
    }
    uVar19 = slen - 4;
    pbVar8 = (byte *)src + 4;
    goto LAB_001126f0;
  }
LAB_001128f1:
  iVar13 = 0;
LAB_001128f4:
  if ((int)uVar6 < 0) {
    if (((char)uVar10 != '.') && ((int)uVar10 != 0x3d)) {
      if (((&ascii_internal::kPropertyBits)[uVar10] & 8) == 0) goto switchD_001129f0_caseD_1;
      goto LAB_00112901;
    }
  }
  else {
LAB_00112901:
    if (((char)uVar10 != '.') && (uVar17 = uVar12, (int)uVar10 != 0x3d)) {
      while( true ) {
        do {
          do {
            uVar12 = uVar17;
            pbVar9 = pbVar8;
            uVar14 = uVar19;
            uVar10 = 0;
            while( true ) {
              uVar16 = uVar10;
              if (uVar14 == uVar16) {
                pbVar8 = pbVar9 + uVar14;
                lVar15 = 0;
                goto LAB_001129d5;
              }
              uVar19 = (ulong)pbVar9[uVar16];
              if (-1 < unbase64[uVar19]) break;
              uVar10 = uVar16 + 1;
              if (((&ascii_internal::kPropertyBits)[uVar19] & 8) == 0) {
                pbVar8 = pbVar9 + uVar16;
                lVar15 = (uVar14 - (uVar16 + 1)) + 1;
                if ((uVar19 == 0x2e) || (pbVar9[uVar16] == 0x3d)) goto LAB_001129d5;
                goto switchD_001129f0_caseD_1;
              }
            }
            uVar6 = uVar7 << 6;
            uVar5 = (int)unbase64[uVar19] | uVar6;
            iVar13 = iVar13 + 1;
            uVar19 = ~uVar16 + uVar14;
            pbVar8 = pbVar9 + uVar16 + 1;
            uVar7 = uVar5;
            uVar17 = uVar12;
          } while (iVar13 != 4);
          uVar17 = uVar12 + 3;
          uVar19 = ~uVar16 + uVar14;
          iVar13 = 0;
          uVar7 = 0;
          pbVar8 = pbVar9 + uVar16 + 1;
        } while (pcVar2 == (pointer)0x0);
        if (uVar11 < uVar17) break;
        pcVar2[uVar12 + 2] = (char)uVar5;
        pcVar2[uVar12 + 1] = (char)(uVar6 >> 8);
        pcVar2[uVar12] = (char)(uVar6 >> 0x10);
        uVar7 = 0;
      }
      goto switchD_001129f0_caseD_1;
    }
  }
  lVar15 = uVar19 + 1;
  pbVar8 = pbVar8 + -1;
LAB_001129d5:
  switch(iVar13) {
  case 0:
    uVar6 = 0xffffffff;
    uVar10 = uVar12;
    break;
  case 1:
    goto switchD_001129f0_caseD_1;
  case 2:
    uVar10 = uVar12 + 1;
    uVar6 = 0xfffffffd;
    if (pcVar2 != (pointer)0x0) {
      if (uVar11 < uVar10) goto switchD_001129f0_caseD_1;
      pcVar2[uVar12] = (char)(uVar7 >> 4);
    }
    break;
  case 3:
    uVar10 = uVar12 + 2;
    uVar6 = 0xfffffffe;
    if (pcVar2 != (pointer)0x0) {
      if (uVar11 < uVar10) goto switchD_001129f0_caseD_1;
      pcVar2[uVar12 + 1] = (char)(uVar7 >> 2);
      pcVar2[uVar12] = (char)(uVar7 >> 10);
    }
    break;
  default:
    raw_log_internal::RawLog
              (kFatal,"escaping.cc",0x2ad,"This can\'t happen; base64 decoder state = %d");
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O2/_deps/absl-src/absl/strings/escaping.cc"
                  ,0x2ad,
                  "bool absl::(anonymous namespace)::Base64UnescapeInternal(absl::Nullable<const char *>, size_t, absl::Nullable<char *>, size_t, absl::Nonnull<const signed char *>, absl::Nonnull<size_t *>)"
                 );
  }
  uVar7 = 0;
  for (lVar4 = 0; lVar15 != lVar4; lVar4 = lVar4 + 1) {
    bVar1 = pbVar8[lVar4];
    if ((bVar1 == 0x3d) || (bVar1 == 0x2e)) {
      uVar7 = uVar7 + 1;
    }
    else if (((&ascii_internal::kPropertyBits)[bVar1] & 8) == 0) goto switchD_001129f0_caseD_1;
  }
  if ((uVar7 & uVar6) == 0) {
    if (uVar10 <= uVar11) {
      std::__cxx11::string::erase((ulong)dest,uVar10);
      return true;
    }
    __assert_fail("len <= dest_len",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O2/_deps/absl-src/absl/strings/escaping.cc"
                  ,0x341,
                  "bool absl::(anonymous namespace)::Base64UnescapeInternal(absl::Nullable<const char *>, size_t, absl::Nonnull<String *>, absl::Nonnull<const signed char *>) [String = std::basic_string<char>]"
                 );
  }
switchD_001129f0_caseD_1:
  dest->_M_string_length = 0;
  *(dest->_M_dataplus)._M_p = '\0';
  return false;
code_r0x001127cf:
  uVar18 = uVar18 + 1;
  uVar17 = uVar17 - 1;
  uVar14 = uVar14 - 1;
  uVar16 = uVar16 - 1;
  if (uVar19 < 4) {
LAB_00112897:
    iVar13 = 0;
    goto LAB_001128f4;
  }
  goto LAB_001127ae;
LAB_0011280a:
  uVar19 = uVar18;
  uVar10 = (ulong)((byte *)src)[uVar19 + 1];
  uVar6 = (uint)unbase64[uVar10];
  if ((int)uVar6 < 0) {
    if (((&ascii_internal::kPropertyBits)[uVar10] & 8) != 0) goto code_r0x001127f3;
    goto LAB_001128b4;
  }
  pbVar8 = (byte *)src + uVar19 + 2;
  while( true ) {
    uVar19 = uVar14;
    uVar10 = (ulong)*pbVar8;
    uVar6 = (uint)unbase64[uVar10];
    pbVar8 = pbVar8 + 1;
    if (-1 < (int)uVar6) break;
    if ((((&ascii_internal::kPropertyBits)[uVar10] & 8) == 0) ||
       (uVar16 = uVar16 - 1, uVar14 = uVar19 - 1, uVar19 < 2)) goto LAB_001128d1;
  }
  while( true ) {
    uVar19 = uVar16;
    uVar10 = (ulong)*pbVar8;
    pbVar8 = pbVar8 + 1;
    uVar6 = (uint)unbase64[uVar10];
    if (-1 < (int)uVar6) break;
    if ((((&ascii_internal::kPropertyBits)[uVar10] & 8) == 0) || (uVar16 = uVar19 - 1, uVar19 == 0))
    goto LAB_001128f4;
  }
LAB_00112881:
  uVar12 = uVar12 + 3;
  src = (Nullable<const_char_*>)pbVar8;
  slen = uVar19;
  goto LAB_00112730;
code_r0x001127f3:
  uVar14 = uVar14 - 1;
  uVar16 = uVar16 - 1;
  bVar3 = uVar17 < 3;
  uVar17 = uVar17 - 1;
  uVar18 = uVar19 + 1;
  if (bVar3) {
LAB_001128b4:
    pbVar8 = (byte *)src + uVar19 + 2;
    uVar19 = ~(uVar19 + 1) + slen;
    iVar13 = 1;
    goto LAB_001128f4;
  }
  goto LAB_0011280a;
code_r0x00112628:
  uVar14 = uVar14 + 1;
  lVar15 = lVar15 + -1;
  uVar17 = uVar17 - 1;
  if (uVar19 < 4) {
LAB_0011288a:
    iVar13 = 0;
    uVar6 = uVar5;
    goto LAB_001128f4;
  }
  goto LAB_00112607;
LAB_0011263f:
  uVar16 = uVar14;
  uVar19 = slen + lVar15;
  uVar10 = (ulong)((byte *)src)[uVar16 + 1];
  uVar6 = (uint)unbase64[uVar10];
  if ((int)uVar6 < 0) {
    if (((&ascii_internal::kPropertyBits)[uVar10] & 8) != 0) goto code_r0x00112663;
    goto LAB_0011289f;
  }
  uVar7 = uVar5 << 6 | uVar6;
  pbVar8 = (byte *)src + uVar16 + 2;
  while( true ) {
    uVar10 = (ulong)*pbVar8;
    pbVar8 = pbVar8 + 1;
    uVar6 = (uint)unbase64[uVar10];
    if (-1 < (int)uVar6) break;
    uVar19 = uVar19 - 1;
    if ((((&ascii_internal::kPropertyBits)[uVar10] & 8) == 0) || (uVar17 = uVar17 - 1, uVar19 < 2))
    goto LAB_001128d1;
  }
  uVar7 = uVar7 << 6 | uVar6;
  while( true ) {
    uVar19 = uVar17;
    uVar10 = (ulong)*pbVar8;
    pbVar8 = pbVar8 + 1;
    uVar6 = (uint)unbase64[uVar10];
    if (-1 < (int)uVar6) break;
    if ((((&ascii_internal::kPropertyBits)[uVar10] & 8) == 0) || (uVar17 = uVar19 - 1, uVar19 == 0))
    goto LAB_001128f4;
  }
  uVar7 = uVar7 << 6 | uVar6;
LAB_001126f0:
  if (uVar11 < uVar12 + 3) goto switchD_001129f0_caseD_1;
  *(ushort *)(pcVar2 + uVar12 + 1) = (ushort)uVar7 << 8 | (ushort)uVar7 >> 8;
  pcVar2[uVar12] = (char)(uVar7 >> 0x10);
  src = (Nullable<const_char_*>)pbVar8;
  uVar12 = uVar12 + 3;
  slen = uVar19;
  uVar7 = uVar7 >> 0x10;
  goto LAB_00112595;
code_r0x00112663:
  lVar15 = lVar15 + -1;
  uVar17 = uVar17 - 1;
  uVar14 = uVar16 + 1;
  if (uVar19 < 3) {
LAB_0011289f:
    pbVar8 = (byte *)src + uVar16 + 2;
    uVar19 = ~(uVar16 + 1) + slen;
    iVar13 = 1;
    uVar7 = uVar5;
    goto LAB_001128f4;
  }
  goto LAB_0011263f;
LAB_001128d1:
  iVar13 = 2;
  goto LAB_001128f4;
}

Assistant:

bool Base64UnescapeInternal(absl::Nullable<const char*> src, size_t slen,
                            absl::Nonnull<String*> dest,
                            absl::Nonnull<const signed char*> unbase64) {
  // Determine the size of the output string.  Base64 encodes every 3 bytes into
  // 4 characters.  Any leftover chars are added directly for good measure.
  const size_t dest_len = 3 * (slen / 4) + (slen % 4);

  strings_internal::STLStringResizeUninitialized(dest, dest_len);

  // We are getting the destination buffer by getting the beginning of the
  // string and converting it into a char *.
  size_t len;
  const bool ok =
      Base64UnescapeInternal(src, slen, &(*dest)[0], dest_len, unbase64, &len);
  if (!ok) {
    dest->clear();
    return false;
  }

  // could be shorter if there was padding
  assert(len <= dest_len);
  dest->erase(len);

  return true;
}